

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestAssign(void)

{
  uint64_t big;
  Bignum bignum2;
  Bignum bignum;
  char buffer [1024];
  char *in_stack_fffffffffffff7e8;
  char *pcVar1;
  char *in_stack_fffffffffffff7f0;
  Chunk in_stack_fffffffffffff7f8;
  undefined2 in_stack_fffffffffffff7fc;
  uint16_t in_stack_fffffffffffff7fe;
  Bignum *in_stack_fffffffffffff800;
  Chunk in_stack_fffffffffffff808;
  Chunk in_stack_fffffffffffff80c;
  Bignum *in_stack_fffffffffffff810;
  Chunk in_stack_fffffffffffff81c;
  char *in_stack_fffffffffffff820;
  Bignum *in_stack_fffffffffffff828;
  Bignum local_60c [3];
  
  double_conversion::Bignum::Bignum(local_60c);
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff7f0);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff800,in_stack_fffffffffffff7fe);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff800,in_stack_fffffffffffff7fe);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff800,in_stack_fffffffffffff7fe);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  pcVar1 = (char *)0xffffffffffffffff;
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  pcVar1 = (char *)0x123456789abcdef0;
  double_conversion::Bignum::AssignUInt64
            (in_stack_fffffffffffff800,
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  double_conversion::Bignum::AssignBignum
            (in_stack_fffffffffffff800,
             (Bignum *)
             CONCAT26(in_stack_fffffffffffff7fe,
                      CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  AssignDecimalString(in_stack_fffffffffffff810,
                      (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  AssignDecimalString(in_stack_fffffffffffff810,
                      (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  AssignDecimalString(in_stack_fffffffffffff810,
                      (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              in_stack_fffffffffffff7f0,SUB81((ulong)pcVar1 >> 0x38,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    in_stack_fffffffffffff7f0,pcVar1);
  return;
}

Assistant:

TEST(Assign) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum bignum2;
  bignum.AssignUInt16(0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);
  bignum.AssignUInt16(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);
  bignum.AssignUInt16(0x20);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20", buffer);


  bignum.AssignUInt64(0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);
  bignum.AssignUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);
  bignum.AssignUInt64(0x20);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20", buffer);
  bignum.AssignUInt64(0x100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100", buffer);

  // The first real test, since this will not fit into one bigit.
  bignum.AssignUInt64(0x12345678);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("12345678", buffer);

  uint64_t big = DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF);
  bignum.AssignUInt64(big);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFF", buffer);

  big = DOUBLE_CONVERSION_UINT64_2PART_C(0x12345678, 9ABCDEF0);
  bignum.AssignUInt64(big);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);

  bignum2.AssignBignum(bignum);
  CHECK(bignum2.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);

  AssignDecimalString(&bignum, "0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignDecimalString(&bignum, "1");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  AssignDecimalString(&bignum, "1234567890");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("499602D2", buffer);

  AssignHexString(&bignum, "0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "123456789ABCDEF0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);
}